

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_stream.cpp
# Opt level: O2

void __thiscall dpfb::streams::FileStream::seek(FileStream *this,int64_t offset,SeekOrigin origin)

{
  int iVar1;
  
  if (origin != end) {
    origin = (uint)(origin == cur);
  }
  iVar1 = fseek((FILE *)this->fp,offset,origin);
  if (iVar1 == 0) {
    return;
  }
  throwErrno();
}

Assistant:

void FileStream::seek(std::int64_t offset, SeekOrigin origin)
{
    int whence = SEEK_SET;
    switch (origin) {
        case SeekOrigin::set:
            whence = SEEK_SET;
            break;
        case SeekOrigin::cur:
            whence = SEEK_CUR;
            break;
        case SeekOrigin::end:
            whence = SEEK_END;
            break;
    }

    if (std::fseek(fp, offset, whence) != 0)
        throwErrno();
}